

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# distribution.hpp
# Opt level: O2

void mxx::
     redo_arbit_decomposition<__gnu_cxx::__normal_iterator<TwoBSA<unsigned_int>*,std::vector<TwoBSA<unsigned_int>,std::allocator<TwoBSA<unsigned_int>>>>,__gnu_cxx::__normal_iterator<TwoBSA<unsigned_int>*,std::vector<TwoBSA<unsigned_int>,std::allocator<TwoBSA<unsigned_int>>>>>
               (__normal_iterator<TwoBSA<unsigned_int>_*,_std::vector<TwoBSA<unsigned_int>,_std::allocator<TwoBSA<unsigned_int>_>_>_>
                begin,__normal_iterator<TwoBSA<unsigned_int>_*,_std::vector<TwoBSA<unsigned_int>,_std::allocator<TwoBSA<unsigned_int>_>_>_>
                      end,
               __normal_iterator<TwoBSA<unsigned_int>_*,_std::vector<TwoBSA<unsigned_int>,_std::allocator<TwoBSA<unsigned_int>_>_>_>
               out,size_t new_local_size,comm *comm)

{
  int iVar1;
  TwoBSA<unsigned_int> *out_00;
  unsigned_long uVar2;
  unsigned_long uVar3;
  unsigned_long uVar4;
  int iVar5;
  pointer puVar6;
  ulong uVar7;
  ulong uVar8;
  ulong uVar9;
  ulong uVar10;
  size_t __n;
  allocator_type local_91;
  size_t local_size;
  TwoBSA<unsigned_int> *local_88;
  vector<unsigned_long,_std::allocator<unsigned_long>_> send_counts;
  size_t new_local_size_local;
  vector<unsigned_long,_std::allocator<unsigned_long>_> recv_counts;
  vector<unsigned_long,_std::allocator<unsigned_long>_> new_local_sizes;
  
  __n = (long)end._M_current - (long)begin._M_current;
  local_size = (long)__n / 0xc;
  new_local_size_local = new_local_size;
  if (comm->m_size == 1) {
    if (local_size != new_local_size) {
      assert_fail("local_size == new_local_size",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/ParBLiSS[P]psac/ext/mxx/include/mxx/distribution.hpp"
                  ,0x19a,"redo_arbit_decomposition");
    }
    if (end._M_current != begin._M_current) {
      memmove(out._M_current,begin._M_current,__n);
      return;
    }
  }
  else {
    local_88 = out._M_current;
    uVar2 = allreduce<unsigned_long,std::plus<unsigned_long>>(&local_size,comm,(long)__n % 0xc);
    uVar3 = exscan<unsigned_long,std::plus<unsigned_long>>(&local_size,comm);
    iVar1 = comm->m_rank;
    allgather<unsigned_long>(&new_local_sizes,&new_local_size_local,comm);
    uVar4 = 0;
    for (puVar6 = new_local_sizes.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                  _M_impl.super__Vector_impl_data._M_start;
        puVar6 != new_local_sizes.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                  _M_impl.super__Vector_impl_data._M_finish; puVar6 = puVar6 + 1) {
      uVar4 = uVar4 + *puVar6;
    }
    if (iVar1 == 0) {
      uVar3 = 0;
    }
    if (uVar4 != uVar2) {
      assert_fail("std::accumulate(new_local_sizes.begin(), new_local_sizes.end(), 0ull) == total_size"
                  ,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/ParBLiSS[P]psac/ext/mxx/include/mxx/distribution.hpp"
                  ,0x1b8,"redo_arbit_decomposition");
    }
    recv_counts.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
              (&send_counts,(long)comm->m_size,(value_type_conflict1 *)&recv_counts,&local_91);
    out_00 = local_88;
    iVar1 = comm->m_size;
    iVar5 = 1;
    if (1 < iVar1) {
      iVar5 = iVar1;
    }
    uVar8 = 0;
    for (uVar9 = 0;
        (uVar7 = (ulong)(iVar5 - 1), uVar10 = local_size, iVar5 - 1 != uVar9 &&
        (puVar6 = new_local_sizes.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                  _M_impl.super__Vector_impl_data._M_start + uVar9, uVar7 = uVar9,
        *puVar6 + uVar8 <= uVar3)); uVar9 = uVar9 + 1) {
      uVar8 = *puVar6 + uVar8;
    }
    for (; (uVar10 != 0 && ((long)uVar7 < (long)iVar1)); uVar7 = uVar7 + 1) {
      uVar8 = uVar8 + new_local_sizes.
                      super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                      super__Vector_impl_data._M_start[uVar7];
      uVar9 = uVar8 - uVar3;
      if (uVar10 < uVar8 - uVar3) {
        uVar9 = uVar10;
      }
      send_counts.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start[uVar7] = uVar9;
      uVar3 = uVar3 + uVar9;
      uVar10 = uVar10 - uVar9;
    }
    all2all<unsigned_long>(&recv_counts,&send_counts,comm);
    all2allv<TwoBSA<unsigned_int>>(begin._M_current,&send_counts,out_00,&recv_counts,comm);
    std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
              (&recv_counts.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>);
    std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
              (&send_counts.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>);
    std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
              (&new_local_sizes.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>);
  }
  return;
}

Assistant:

void redo_arbit_decomposition(_InIterator begin, _InIterator end, _OutIterator out, std::size_t new_local_size, const mxx::comm& comm) {
    // get local size
    std::size_t local_size = std::distance(begin, end);

    // if single process, simply copy to output
    if (comm.size() == 1) {
        MXX_ASSERT(local_size == new_local_size);
        std::copy(begin, end, out);
        return;
    }

    // get prefix sum of size and total size
#if !defined(NDEBUG) || MEASURE_LOAD_BALANCE != 0
    size_t total_size = mxx::allreduce(local_size, comm);
#endif
    size_t prefix = mxx::exscan(local_size, comm);
    if (comm.rank() == 0)
        prefix = 0;

#if MEASURE_LOAD_BALANCE
    size_t min = mxx::reduce(local_size, 0, mxx::min<size_t>(), comm);
    size_t max = mxx::reduce(local_size, 0, mxx::max<size_t>(), comm);
    size_t min_new = mxx::reduce(new_local_size, 0, mxx::min<size_t>(), comm);
    size_t max_new = mxx::reduce(new_local_size, 0, mxx::max<size_t>(), comm);
    if(comm.rank() == 0)
      std::cerr << " Decomposition: old [" << min << "," << max << "], new= [" << min_new << "," << max_new << "], for n=" << total_size << " fair decomposition: " << total_size / comm.size() << std::endl;

    std::vector<std::size_t> toReceive = mxx::gather(new_local_size, 0, comm);
    if(comm.rank() == 0)
      std::cerr << toReceive << std::endl;
#endif

    // get the new local sizes from all processors
    // NOTE: this all-gather is what makes the arbitrary decomposition worse
    // in terms of complexity than when assuming a block decomposition
    std::vector<std::size_t> new_local_sizes = mxx::allgather(new_local_size, comm);
    MXX_ASSERT(std::accumulate(new_local_sizes.begin(), new_local_sizes.end(), 0ull) == total_size);

    // calculate where to send elements
    std::vector<size_t> send_counts(comm.size(), 0);
    int first_p;
    std::size_t new_prefix = 0;
    for (first_p = 0; first_p < comm.size()-1; ++first_p)
    {
        // find processor for which the prefix sum exceeds mine
        // i have to send to the previous
        if (new_prefix + new_local_sizes[first_p] > prefix)
            break;
        new_prefix += new_local_sizes[first_p];
    }

    //= block_partition_target_processor(total_size, p, prefix);
    std::size_t left_to_send = local_size;
    for (; left_to_send > 0 && first_p < comm.size(); ++first_p)
    {
        // make the `new` prefix inclusive (is an exlcusive prefix prior)
        new_prefix += new_local_sizes[first_p];
        // send as many elements to the current processor as it needs to fill
        // up, but at most as many as I have left
        std::size_t nsend = std::min<std::size_t>(new_prefix - prefix, left_to_send);
        send_counts[first_p] = nsend;
        // update the number of elements i have left (`left_to_send`) and
        // at which global index they start `prefix`
        left_to_send -= nsend;
        prefix += nsend;
    }

    std::vector<size_t> recv_counts = mxx::all2all(send_counts, comm);
    // TODO: all2allv for iterators
    mxx::all2allv(&(*begin), send_counts, &(*out), recv_counts, comm);
}